

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O1

int Gia_ManCountRanks(Gia_Man_t *p)

{
  uint Rank;
  uint uVar1;
  uint uVar2;
  Vec_Int_t *vRanks;
  int *piVar3;
  Vec_Int_t *vCands;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  double dVar11;
  
  iVar7 = p->nObjs;
  vRanks = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar8 = iVar7;
  }
  vRanks->nSize = 0;
  vRanks->nCap = iVar8;
  if (iVar8 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar8 * 4);
  }
  vRanks->pArray = piVar3;
  vRanks->nSize = iVar7;
  if (piVar3 != (int *)0x0) {
    memset(piVar3,0xff,(long)iVar7 * 4);
  }
  vCands = (Vec_Int_t *)malloc(0x10);
  vCands->nSize = 0;
  vCands->nCap = iVar8;
  if (iVar8 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar8 << 2);
  }
  vCands->pArray = piVar3;
  vCands->nSize = iVar7;
  if (piVar3 != (int *)0x0) {
    memset(piVar3,0,(long)iVar7 << 2);
  }
  if (p->vCos->nSize <= p->nRegs) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                  ,0x14c,"int Gia_ManCountRanks(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
  }
  *p->pTravIds = p->nTravIds;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  pVVar4 = p->vCos;
  uVar5 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar10 = 0;
    do {
      if ((int)uVar5 <= lVar10) {
LAB_00574703:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = pVVar4->pArray[lVar10];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p_00,iVar7 - (*(uint *)(p->pObjs + iVar7) & 0x1fffffff));
      lVar10 = lVar10 + 1;
      pVVar4 = p->vCos;
      uVar5 = (ulong)pVVar4->nSize;
    } while (lVar10 < (long)(uVar5 - (long)p->nRegs));
  }
  if (p_00->nSize < 1) {
    Rank = 0;
  }
  else {
    Rank = 0;
    uVar1 = p_00->nSize;
    uVar9 = 0;
    do {
      uVar2 = uVar1;
      uVar5 = (ulong)uVar9;
      do {
        if (((int)uVar9 < 0) || (p_00->nSize <= (int)uVar5)) goto LAB_00574703;
        Gia_ManCountRanks_rec(p,p_00->pArray[uVar5],p_00,vRanks,vCands,Rank);
        uVar5 = uVar5 + 1;
      } while ((int)uVar5 < (int)uVar2);
      Rank = Rank + 1;
      uVar1 = p_00->nSize;
      uVar9 = uVar2;
    } while ((int)uVar2 < p_00->nSize);
  }
  if (vCands->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  piVar3 = vCands->pArray;
  *piVar3 = 0;
  lVar10 = (long)vCands->nSize;
  if (lVar10 < 1) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    do {
      uVar5 = (ulong)(uint)((int)uVar5 + piVar3[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar10 != lVar6);
  }
  if (vCands->nSize < 1) {
    dVar11 = 0.0;
  }
  else {
    lVar6 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + piVar3[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar10 != lVar6);
    dVar11 = (double)iVar7 * 100.0;
  }
  iVar7 = p->vCis->nSize;
  printf("Tents = %6d.   Cands = %6d.  %10.2f %%\n",
         dVar11 / (double)(iVar7 + p->nObjs + ~(p->vCos->nSize + iVar7)),(ulong)Rank,uVar5);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (vRanks->pArray != (int *)0x0) {
    free(vRanks->pArray);
    vRanks->pArray = (int *)0x0;
  }
  free(vRanks);
  if (vCands->pArray != (int *)0x0) {
    free(vCands->pArray);
    vCands->pArray = (int *)0x0;
  }
  free(vCands);
  return Rank;
}

Assistant:

int Gia_ManCountRanks( Gia_Man_t * p )
{
    Vec_Int_t * vRoots;
    Vec_Int_t * vRanks = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vCands = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj;  
    int t, i, iObj, nSizeCurr = 0;
    assert( Gia_ManPoNum(p) > 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    vRoots = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, pObj) );
    for ( t = 0; nSizeCurr < Vec_IntSize(vRoots); t++ )
    {
        int nSizePrev = nSizeCurr;
        nSizeCurr = Vec_IntSize(vRoots);
        Vec_IntForEachEntryStartStop( vRoots, iObj, i, nSizePrev, nSizeCurr )
            Gia_ManCountRanks_rec( p, iObj, vRoots, vRanks, vCands, t );
    }
    Vec_IntWriteEntry( vCands, 0, 0 );
    printf( "Tents = %6d.   Cands = %6d.  %10.2f %%\n", t, Vec_IntSum(vCands), 100.0*Vec_IntSum(vCands)/Gia_ManCandNum(p) );
    Vec_IntFree( vRoots );
    Vec_IntFree( vRanks );
    Vec_IntFree( vCands );
    return t;
}